

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_circle_lines(int center_x,int center_y,float radius,rf_color color)

{
  _Bool _Var1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  _Var1 = rf_gfx_check_buffer_limit(0x48);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  uVar2 = 0;
  while (uVar2 < 0x168) {
    fVar3 = sinf((float)(long)uVar2 * 0.017453292);
    fVar4 = cosf((float)(long)uVar2 * 0.017453292);
    rf_gfx_vertex2f(fVar3 * radius + (float)center_x,fVar4 * radius + (float)center_y);
    uVar2 = uVar2 + 10;
    fVar3 = sinf((float)(long)uVar2 * 0.017453292);
    fVar4 = cosf((float)(long)uVar2 * 0.017453292);
    rf_gfx_vertex2f(fVar3 * radius + (float)center_x,fVar4 * radius + (float)center_y);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_lines(int center_x, int center_y, float radius, rf_color color)
{
    if (rf_gfx_check_buffer_limit(2 * 36)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    // NOTE: Circle outline is drawn pixel by pixel every degree (0 to 360)
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*i)*radius, center_y + cosf(RF_DEG2RAD*i)*radius);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*(i + 10))*radius, center_y + cosf(RF_DEG2RAD*(i + 10))*radius);
    }
    rf_gfx_end();
}